

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

string * CoreML::Specification::NeuralNetworkMultiArrayShapeMapping_Name_abi_cxx11_
                   (NeuralNetworkMultiArrayShapeMapping value)

{
  int iVar1;
  string *psVar2;
  
  if (NeuralNetworkMultiArrayShapeMapping_Name[abi:cxx11](CoreML::Specification::NeuralNetworkMultiArrayShapeMapping)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&NeuralNetworkMultiArrayShapeMapping_Name[abi:cxx11](CoreML::Specification::NeuralNetworkMultiArrayShapeMapping)
                                 ::dummy);
    if (iVar1 != 0) {
      NeuralNetworkMultiArrayShapeMapping_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)NeuralNetworkMultiArrayShapeMapping_entries,
                      (int *)&NeuralNetworkMultiArrayShapeMapping_entries_by_number,2,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)NeuralNetworkMultiArrayShapeMapping_strings_abi_cxx11_);
      __cxa_guard_release(&NeuralNetworkMultiArrayShapeMapping_Name[abi:cxx11](CoreML::Specification::NeuralNetworkMultiArrayShapeMapping)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)NeuralNetworkMultiArrayShapeMapping_entries,
                     (int *)&NeuralNetworkMultiArrayShapeMapping_entries_by_number,2,value);
  if (iVar1 == -1) {
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
      google::protobuf::internal::InitProtobufDefaultsSlow();
    }
  }
  else {
    psVar2 = (string *)(NeuralNetworkMultiArrayShapeMapping_strings_abi_cxx11_ + (long)iVar1 * 0x20)
    ;
  }
  return psVar2;
}

Assistant:

const std::string& NeuralNetworkMultiArrayShapeMapping_Name(
    NeuralNetworkMultiArrayShapeMapping value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          NeuralNetworkMultiArrayShapeMapping_entries,
          NeuralNetworkMultiArrayShapeMapping_entries_by_number,
          2, NeuralNetworkMultiArrayShapeMapping_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      NeuralNetworkMultiArrayShapeMapping_entries,
      NeuralNetworkMultiArrayShapeMapping_entries_by_number,
      2, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     NeuralNetworkMultiArrayShapeMapping_strings[idx].get();
}